

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprand.h
# Opt level: O1

void rprand_set_seed(unsigned_long_long seed)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (seed + 0x9e3779b97f4a7c15 >> 0x1e ^ seed + 0x9e3779b97f4a7c15) * -0x40a7b892e31b1a47;
  uVar2 = (uVar2 >> 0x1b ^ uVar2) * -0x6b2fb644ecceee15;
  rprand_state_0 = (uint)(uVar2 >> 0x1f) ^ (uint)uVar2;
  uVar2 = (seed + 0x3c6ef372fe94f82a >> 0x1e ^ seed + 0x3c6ef372fe94f82a) * -0x40a7b892e31b1a47;
  uVar1 = (uint)((uVar2 >> 0x1b ^ uVar2) * -0x6b2fb644ecceee15 >> 0x20);
  rprand_state_1 = uVar1 >> 0x1f ^ uVar1;
  uVar2 = (seed + 0xdaa66d2c7ddf743f >> 0x1e ^ seed + 0xdaa66d2c7ddf743f) * -0x40a7b892e31b1a47;
  uVar2 = (uVar2 >> 0x1b ^ uVar2) * -0x6b2fb644ecceee15;
  rprand_state_2 = (uint)(uVar2 >> 0x1f) ^ (uint)uVar2;
  uVar2 = (seed + 0x78dde6e5fd29f054 >> 0x1e ^ seed + 0x78dde6e5fd29f054) * -0x40a7b892e31b1a47;
  uVar1 = (uint)((uVar2 >> 0x1b ^ uVar2) * -0x6b2fb644ecceee15 >> 0x20);
  rprand_state_3 = uVar1 >> 0x1f ^ uVar1;
  return;
}

Assistant:

void rprand_set_seed(unsigned long long seed)
{
    rprand_seed = (uint64_t)seed;    // Set SplitMix64 seed for further use

    // To generate the Xoshiro128** state, we use SplitMix64 generator first
    // We generate 4 pseudo-random 64bit numbers that we combine using their LSB|MSB
    rprand_state[0] = (uint32_t)(rprand_splitmix64() & 0xffffffff);
    rprand_state[1] = (uint32_t)((rprand_splitmix64() & 0xffffffff00000000) >> 32);
    rprand_state[2] = (uint32_t)(rprand_splitmix64() & 0xffffffff);
    rprand_state[3] = (uint32_t)((rprand_splitmix64() & 0xffffffff00000000) >> 32);
}